

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase238::run(TestCase238 *this)

{
  bool bVar1;
  __pid_t _Var2;
  AsyncIoProvider *pAVar3;
  AsyncIoStream *pAVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  String local_100;
  bool local_e1;
  undefined1 local_e0 [7];
  bool _kj_shouldLog_1;
  Promise<unsigned_long> local_c8;
  unsigned_long local_b8;
  uint local_b0;
  bool local_a9;
  undefined1 local_a8 [7];
  bool _kj_shouldLog;
  Promise<void> local_98;
  char local_85 [4];
  Type local_81;
  undefined1 local_80 [3];
  char buf [4];
  undefined1 local_60 [8];
  PipeThread pipeThread;
  AsyncIoContext ioContext;
  TestCase238 *this_local;
  
  ioContext.unixEventPort = (UnixEventPort *)this;
  setupAsyncIo();
  pAVar3 = Own<kj::AsyncIoProvider>::operator->
                     ((Own<kj::AsyncIoProvider> *)&ioContext.lowLevelProvider.ptr);
  Function<void(kj::AsyncIoProvider&,kj::AsyncIoStream&,kj::WaitScope&)>::
  Function<kj::(anonymous_namespace)::TestCase238::run()::__0>
            ((Function<void(kj::AsyncIoProvider&,kj::AsyncIoStream&,kj::WaitScope&)> *)local_80,
             &local_81);
  (*pAVar3->_vptr_AsyncIoProvider[4])(local_60,pAVar3,local_80);
  Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)>::~Function
            ((Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)> *)
             local_80);
  pAVar4 = Own<kj::AsyncIoStream>::operator->((Own<kj::AsyncIoStream> *)&pipeThread.thread.ptr);
  (**(pAVar4->super_AsyncOutputStream)._vptr_AsyncOutputStream)
            (&local_98,&pAVar4->super_AsyncOutputStream,"bar",3);
  Promise<void>::wait(&local_98,ioContext.provider.ptr);
  Promise<void>::~Promise(&local_98);
  pAVar4 = Own<kj::AsyncIoStream>::operator->((Own<kj::AsyncIoStream> *)&pipeThread.thread.ptr);
  (*(pAVar4->super_AsyncInputStream)._vptr_AsyncInputStream[1])(local_a8,pAVar4,local_85,3,4);
  _Var2 = Promise<unsigned_long>::wait((Promise<unsigned_long> *)local_a8,ioContext.provider.ptr);
  Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)local_a8);
  if (CONCAT44(extraout_var,_Var2) != 3) {
    local_a9 = _::Debug::shouldLog(ERROR);
    while (local_a9 != false) {
      local_b0 = 3;
      pAVar4 = Own<kj::AsyncIoStream>::operator->((Own<kj::AsyncIoStream> *)&pipeThread.thread.ptr);
      (*(pAVar4->super_AsyncInputStream)._vptr_AsyncInputStream[1])(&local_c8,pAVar4,local_85,3,4);
      _Var2 = Promise<unsigned_long>::wait(&local_c8,ioContext.provider.ptr);
      local_b8 = CONCAT44(extraout_var_00,_Var2);
      _::Debug::log<char_const(&)[89],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
                 ,0xfe,ERROR,
                 "\"failed: expected \" \"(3u) == (pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope))\", 3u, pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope)"
                 ,(char (*) [89])
                  "failed: expected (3u) == (pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope))"
                 ,&local_b0,&local_b8);
      Promise<unsigned_long>::~Promise(&local_c8);
      local_a9 = false;
    }
  }
  heapString((String *)local_e0,local_85,3);
  bVar1 = kj::operator==("foo",(String *)local_e0);
  String::~String((String *)local_e0);
  if (!bVar1) {
    local_e1 = _::Debug::shouldLog(ERROR);
    while (local_e1 != false) {
      heapString(&local_100,local_85,3);
      _::Debug::log<char_const(&)[49],char_const(&)[4],kj::String>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
                 ,0xff,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (heapString(buf, 3))\", \"foo\", heapString(buf, 3)"
                 ,(char (*) [49])"failed: expected (\"foo\") == (heapString(buf, 3))",
                 (char (*) [4])0x654402,&local_100);
      String::~String(&local_100);
      local_e1 = false;
    }
  }
  AsyncIoProvider::PipeThread::~PipeThread((PipeThread *)local_60);
  AsyncIoContext::~AsyncIoContext((AsyncIoContext *)&pipeThread.pipe.ptr);
  return;
}

Assistant:

TEST(AsyncIo, PipeThread) {
  auto ioContext = setupAsyncIo();

  auto pipeThread = ioContext.provider->newPipeThread(
      [](AsyncIoProvider& ioProvider, AsyncIoStream& stream, WaitScope& waitScope) {
    char buf[4];
    stream.write("foo", 3).wait(waitScope);
    EXPECT_EQ(3u, stream.tryRead(buf, 3, 4).wait(waitScope));
    EXPECT_EQ("bar", heapString(buf, 3));

    // Expect disconnect.
    EXPECT_EQ(0, stream.tryRead(buf, 1, 1).wait(waitScope));
  });

  char buf[4];
  pipeThread.pipe->write("bar", 3).wait(ioContext.waitScope);
  EXPECT_EQ(3u, pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope));
  EXPECT_EQ("foo", heapString(buf, 3));
}